

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall CppGenerator::computeViewLevel(CppGenerator *this,size_t group_id,TDNode *node)

{
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *this_00;
  ulong *puVar1;
  bitset<100UL> *__x;
  pointer pbVar2;
  pointer puVar3;
  pointer puVar4;
  pointer pvVar5;
  size_t *psVar6;
  pointer ppAVar7;
  Aggregate *pAVar8;
  size_t *psVar9;
  size_t *psVar10;
  bool bVar11;
  _Base_bitset<2UL> _Var12;
  bool bVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar14;
  bitset<100UL> *this_01;
  size_t sVar15;
  View *pVVar16;
  Function *__x_00;
  ulong uVar17;
  Function *__x_01;
  size_t sVar18;
  size_t *psVar19;
  ulong uVar20;
  size_t f;
  var_bitset *__x_02;
  ulong __position;
  bitset<1500UL> *this_02;
  ulong uVar21;
  size_t var;
  ulong uVar22;
  ulong uVar23;
  size_t f2;
  size_t *psVar24;
  long lVar25;
  size_t *psVar26;
  bool bVar27;
  bitset<100UL> bVar28;
  size_t local_260;
  var_bitset dependentFunctionVars;
  var_bitset varsToCover;
  var_bitset overlapVars;
  var_bitset dependentViewVars;
  prod_bitset overlapFunc;
  var_bitset coveredVariableOrder;
  
  pvVar14 = this->groupVariableOrder + group_id;
  this_00 = &this->coveredVariables;
  pbVar2 = (this->coveredVariables).
           super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->coveredVariables).
      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pbVar2) {
    (this->coveredVariables).
    super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar2;
  }
  this_01 = (this->groupVariableOrderBitset).
            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
            super__Vector_impl_data._M_start + group_id;
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (this_00,(long)(pvVar14->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar14->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(&this->addableViews);
  puVar3 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar15 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->addableViews,(sVar15 + 1) * ((long)puVar3 - (long)puVar4 >> 3),false);
  pvVar5 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = *(pointer *)
            ((long)&pvVar5[group_id].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  __x = &node->_bag;
  for (psVar19 = pvVar5[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start; psVar19 != psVar6; psVar19 = psVar19 + 1)
  {
    pVVar16 = QueryCompiler::getView
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,*psVar19);
    bVar13 = (pVVar16->_fVars).super__Base_bitset<2UL>._M_w[1] == 0;
    bVar11 = (pVVar16->_fVars).super__Base_bitset<2UL>._M_w[0] == 0;
    bVar27 = bVar13 && bVar11;
    if (bVar13 && bVar11) {
      this->viewLevelRegister[*psVar19] =
           (long)(pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3;
    }
    __x_02 = &pVVar16->_fVars;
    varsToCover.super__Base_bitset<2UL>._M_w[0] = (__x_02->super__Base_bitset<2UL>)._M_w[0];
    varsToCover.super__Base_bitset<2UL>._M_w[1] = (pVVar16->_fVars).super__Base_bitset<2UL>._M_w[1];
    dependentViewVars.super__Base_bitset<2UL>._M_w[0] = 0;
    dependentViewVars.super__Base_bitset<2UL>._M_w[1] = 0;
    lVar25 = 0;
    for (uVar22 = 0; uVar22 != 100; uVar22 = uVar22 + 1) {
      if (((__x_02->super__Base_bitset<2UL>)._M_w[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) {
        std::_Base_bitset<2UL>::_M_do_or
                  (&dependentViewVars.super__Base_bitset<2UL>,
                   (_Base_bitset<2UL> *)
                   ((long)(((this->variableDependency).
                            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super__Base_bitset<2UL>).
                          _M_w + lVar25));
      }
      lVar25 = lVar25 + 0x10;
    }
    coveredVariableOrder.super__Base_bitset<2UL>._M_w =
         (_Base_bitset<2UL>)std::bitset<100UL>::operator~(this_01);
    std::_Base_bitset<2UL>::_M_do_and
              (&dependentViewVars.super__Base_bitset<2UL>,
               &coveredVariableOrder.super__Base_bitset<2UL>);
    overlapFunc.super__Base_bitset<24UL>._M_w._0_16_ = std::bitset<100UL>::operator~(this_01);
    coveredVariableOrder.super__Base_bitset<2UL>._M_w =
         (_Base_bitset<2UL>)std::operator&(__x_02,(bitset<100UL> *)&overlapFunc);
    dependentFunctionVars.super__Base_bitset<2UL>._M_w =
         (_Base_bitset<2UL>)std::bitset<100UL>::operator~(__x);
    bVar28 = std::operator&((bitset<100UL> *)&coveredVariableOrder.super__Base_bitset<2UL>,
                            &dependentFunctionVars);
    if (bVar28.super__Base_bitset<2UL>._M_w[1] != 0 || bVar28.super__Base_bitset<2UL>._M_w[0] != 0)
    {
      for (uVar22 = 0;
          ppAVar7 = (pVVar16->_aggregates).
                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar22 < (ulong)((long)(pVVar16->_aggregates).
                                 super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3);
          uVar22 = uVar22 + 1) {
        pAVar8 = ppAVar7[uVar22];
        for (uVar21 = 0;
            lVar25 = *(long *)&(pAVar8->_agg).
                               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                               ._M_impl,
            uVar21 < (ulong)(((long)*(pointer *)
                                     ((long)&(pAVar8->_agg).
                                             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                             ._M_impl + 8) - lVar25) / 0xc0); uVar21 = uVar21 + 1) {
          this_02 = (bitset<1500UL> *)(lVar25 + uVar21 * 0xc0);
          memset(&coveredVariableOrder,0,0xc0);
          for (__position = 0; __position != 0x5dc; __position = __position + 1) {
            bVar13 = std::bitset<1500UL>::test(this_02,__position);
            if ((bVar13) &&
               ((coveredVariableOrder.super__Base_bitset<2UL>._M_w[__position >> 6] >>
                 (__position & 0x3f) & 1) == 0)) {
              __x_00 = QueryCompiler::getFunction
                                 ((this->_qc).
                                  super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,__position);
              bVar28 = std::operator&(&__x_00->_fVars,&dependentViewVars);
              if (bVar28.super__Base_bitset<2UL>._M_w[1] != 0 ||
                  bVar28.super__Base_bitset<2UL>._M_w[0] != 0) {
                dependentFunctionVars.super__Base_bitset<2UL>._M_w = (_Base_bitset<2UL>)ZEXT816(0);
                lVar25 = 0;
                for (uVar23 = 0; uVar23 != 100; uVar23 = uVar23 + 1) {
                  if (((__x_00->_fVars).super__Base_bitset<2UL>._M_w[uVar23 >> 6] >> (uVar23 & 0x3f)
                      & 1) != 0) {
                    std::_Base_bitset<2UL>::_M_do_or
                              (&dependentFunctionVars.super__Base_bitset<2UL>,
                               (_Base_bitset<2UL> *)
                               ((long)(((this->variableDependency).
                                        super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Base_bitset<2UL>)._M_w + lVar25));
                  }
                  lVar25 = lVar25 + 0x10;
                }
                overlapFunc.super__Base_bitset<24UL>._M_w._0_16_ =
                     std::bitset<100UL>::operator~(this_01);
                std::_Base_bitset<2UL>::_M_do_and
                          (&dependentFunctionVars.super__Base_bitset<2UL>,
                           (_Base_bitset<2UL> *)&overlapFunc);
                overlapVars.super__Base_bitset<2UL>._M_w[0] =
                     (__x_00->_fVars).super__Base_bitset<2UL>._M_w[0];
                overlapVars.super__Base_bitset<2UL>._M_w[1] =
                     (__x_00->_fVars).super__Base_bitset<2UL>._M_w[1];
                memset(&overlapFunc,0,0xc0);
                std::bitset<1500UL>::set(&overlapFunc,__position,true);
                do {
                  std::_Base_bitset<2UL>::_M_do_or
                            (&overlapVars.super__Base_bitset<2UL>,(_Base_bitset<2UL> *)__x_00);
                  bVar13 = false;
                  for (uVar23 = 0; uVar23 != 0x5dc; uVar23 = uVar23 + 1) {
                    uVar17 = uVar23 >> 6;
                    uVar20 = 1L << ((byte)uVar23 & 0x3f);
                    if (((((this_02->super__Base_bitset<24UL>)._M_w[uVar17] >> (uVar23 & 0x3f) & 1)
                          != 0) &&
                        ((coveredVariableOrder.super__Base_bitset<2UL>._M_w[uVar17] & uVar20) == 0))
                       && ((overlapFunc.super__Base_bitset<24UL>._M_w[uVar17] & uVar20) == 0)) {
                      __x_01 = QueryCompiler::getFunction
                                         ((this->_qc).
                                          super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr,__position);
                      bVar28 = std::operator&(&__x_01->_fVars,&dependentFunctionVars);
                      if (bVar28.super__Base_bitset<2UL>._M_w[1] != 0 ||
                          bVar28.super__Base_bitset<2UL>._M_w[0] != 0) {
                        std::bitset<1500UL>::set
                                  ((bitset<1500UL> *)&coveredVariableOrder,uVar23,true);
                        std::bitset<1500UL>::set(&overlapFunc,uVar23,true);
                        std::_Base_bitset<2UL>::_M_do_or
                                  (&overlapVars.super__Base_bitset<2UL>,(_Base_bitset<2UL> *)__x_01)
                        ;
                        bVar13 = true;
                      }
                    }
                  }
                } while (bVar13);
                std::_Base_bitset<2UL>::_M_do_or
                          (&varsToCover.super__Base_bitset<2UL>,&overlapVars.super__Base_bitset<2UL>
                          );
              }
            }
          }
        }
      }
    }
    coveredVariableOrder.super__Base_bitset<2UL>._M_w = (_Base_bitset<2UL>)ZEXT816(0);
    psVar26 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    psVar9 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_260 = 0;
    for (; psVar26 != psVar9; psVar26 = psVar26 + 1) {
      std::bitset<100UL>::set(&coveredVariableOrder,*psVar26,true);
      std::bitset<100UL>::set
                ((this_00->
                 super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start + local_260,*psVar26,true);
      overlapFunc.super__Base_bitset<24UL>._M_w._0_16_ = std::operator&(__x,this_01);
      bVar28 = std::operator&((bitset<100UL> *)&overlapFunc,&coveredVariableOrder);
      if ((bVar28.super__Base_bitset<2UL>._M_w[0] == overlapFunc.super__Base_bitset<24UL>._M_w[0])
         && (bVar28.super__Base_bitset<2UL>._M_w[1] == overlapFunc.super__Base_bitset<24UL>._M_w[1])
         ) {
        std::_Base_bitset<2UL>::_M_do_or
                  (&(this_00->
                    super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>).
                    _M_impl.super__Vector_impl_data._M_start[local_260].super__Base_bitset<2UL>,
                   &__x->super__Base_bitset<2UL>);
      }
      psVar10 = this->incomingViews[*psVar19].
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (psVar24 = this->incomingViews[*psVar19].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; psVar24 != psVar10; psVar24 = psVar24 + 1) {
        pVVar16 = QueryCompiler::getView
                            ((this->_qc).
                             super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             *psVar24);
        dependentFunctionVars.super__Base_bitset<2UL>._M_w =
             (_Base_bitset<2UL>)std::operator&(&pVVar16->_fVars,this_01);
        bVar28 = std::operator&(&dependentFunctionVars,&coveredVariableOrder);
        if ((bVar28.super__Base_bitset<2UL>._M_w[0] ==
             dependentFunctionVars.super__Base_bitset<2UL>._M_w[0]) &&
           (bVar28.super__Base_bitset<2UL>._M_w[1] ==
            dependentFunctionVars.super__Base_bitset<2UL>._M_w[1])) {
          sVar15 = *psVar24;
          sVar18 = QueryCompiler::numberOfViews
                             ((this->_qc).
                              super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          uVar22 = (sVar18 + 1) * local_260 + sVar15;
          puVar1 = (this->addableViews).m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + (uVar22 >> 6);
          *puVar1 = *puVar1 | 1L << ((byte)uVar22 & 0x3f);
          std::_Base_bitset<2UL>::_M_do_or
                    (&(this->coveredVariables).
                      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_260].super__Base_bitset<2UL>,
                     &(pVVar16->_fVars).super__Base_bitset<2UL>);
        }
      }
      bVar13 = !bVar27;
      bVar27 = true;
      if (bVar13) {
        bVar28 = std::operator&(&varsToCover,
                                (this_00->
                                super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + local_260);
        _Var12._M_w[1] = varsToCover.super__Base_bitset<2UL>._M_w[1];
        _Var12._M_w[0] = varsToCover.super__Base_bitset<2UL>._M_w[0];
        bVar27 = false;
        if (bVar28.super__Base_bitset<2UL>._M_w == (_Base_bitset<2UL>)_Var12._M_w) {
          this->viewLevelRegister[*psVar19] = local_260;
          bVar27 = true;
        }
      }
      local_260 = local_260 + 1;
    }
  }
  return;
}

Assistant:

void CppGenerator::computeViewLevel(size_t group_id, const TDNode& node)
{
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];

    coveredVariables.clear();
    coveredVariables.resize(varOrder.size());
    
    addableViews.reset();
    addableViews.resize(varOrder.size() * (_qc->numberOfViews()+1));

    for (const size_t& viewID : viewGroups[group_id])
    {
        View* view = _qc->getView(viewID);
        bool setViewLevel = false;
        
        // if this view has no free variables it should be outputted before the join 
        if (view->_fVars.none())
        {
            viewLevelRegister[viewID] = varOrder.size();
            setViewLevel = true;
        }
        
        var_bitset varsToCover = view->_fVars;

        var_bitset dependentViewVars;
        for (size_t var=0; var<NUM_OF_VARIABLES;++var)
        {
            if (view->_fVars[var])
                dependentViewVars |= variableDependency[var];
        }
        dependentViewVars &= ~varOrderBitset;

        // TODO: (consider) should we check for overlap for bag vars that are
        // not in varOrder?
        var_bitset nonJoinVars = view->_fVars & ~varOrderBitset & ~node._bag;
        
        if (nonJoinVars.any())
        {
            //  if this is the case then look for overlapping functions
            for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
            {
                Aggregate* aggregate = view->_aggregates[aggNo];

                for (size_t i = 0; i < aggregate->_agg.size(); ++i)
                {
                    const prod_bitset& product = aggregate->_agg[i];
                    prod_bitset considered;
                        
                    for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                    {
                        if (product.test(f) && !considered[f])
                        {
                            Function* function = _qc->getFunction(f);
                                
                            // check if this function is covered
                            if ((function->_fVars & dependentViewVars).any())
                            {
                                var_bitset dependentFunctionVars;
                                for (size_t var=0; var<NUM_OF_VARIABLES;++var)
                                {
                                    if (function->_fVars[var])
                                        dependentFunctionVars |= variableDependency[var];
                                }
                                dependentFunctionVars &= ~varOrderBitset;

                                // if it is - find functions that overlap
                                bool overlaps;
                                var_bitset overlapVars = function->_fVars;
                                prod_bitset overlapFunc;
                                overlapFunc.set(f);

                                do
                                {
                                    overlaps = false;
                                    overlapVars |= function->_fVars;

                                    for (size_t f2 = 0; f2 < NUM_OF_FUNCTIONS; ++f2)
                                    {
                                        if (product[f2] && !considered[f2] && !overlapFunc[f2])
                                        {
                                            Function* otherFunction = _qc->getFunction(f);
                                            // check if functions overlap
                                            if ((otherFunction->_fVars & dependentFunctionVars).any())
                                            {
                                                considered.set(f2);
                                                overlapFunc.set(f2);
                                                overlaps = true;
                                                overlapVars |= otherFunction->_fVars;
                                            }
                                        }
                                    }
                                } while(overlaps);

                                varsToCover |= overlapVars;
                            }
                        }
                    }                        
                }    
            }
        }
        
        // check when the freeVars of the view are covered - this determines
        // when we need to add the declaration of aggregate array and push to
        // view vector !
        size_t depth = 0;
        var_bitset coveredVariableOrder;
 
        for (const size_t& var : varOrder)
        {
            coveredVariableOrder.set(var);
            coveredVariables[depth].set(var);
            
            var_bitset intersection = node._bag & varOrderBitset;
            if ((intersection & coveredVariableOrder) == intersection) 
                coveredVariables[depth] |= node._bag;

            for (const size_t& incViewID : incomingViews[viewID]) 
            {
                // check if view is covered !
                View* incView = _qc->getView(incViewID);
                
                var_bitset viewJoinVars = incView->_fVars & varOrderBitset;
                if ((viewJoinVars & coveredVariableOrder) == viewJoinVars) 
                {
                    addableViews.set(incViewID + (depth * (_qc->numberOfViews()+1)));
                    coveredVariables[depth] |= incView->_fVars;
                }
            }

            if (!setViewLevel && (varsToCover & coveredVariables[depth]) == varsToCover)
            {
                // this is the depth where we add the declaration of aggregate
                // array and push to the vector !
                viewLevelRegister[viewID] = depth;
                setViewLevel = true;
            }
            ++depth;
        }
    }
}